

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
* Lexer::tokenize(vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
                  *__return_storage_ptr__,string *input)

{
  bool bVar1;
  undefined1 local_88 [8];
  Lexer lexer;
  undefined1 local_40 [4];
  Type type;
  string token;
  string *input_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
  *tokens;
  
  token.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_40);
  Lexer((Lexer *)local_88,input);
  while( true ) {
    bVar1 = Lexer::token((Lexer *)local_88,(string *)local_40,(Type *)&lexer.field_0x3c);
    if (!bVar1) break;
    std::
    vector<std::tuple<std::__cxx11::string,Lexer::Type>,std::allocator<std::tuple<std::__cxx11::string,Lexer::Type>>>
    ::emplace_back<std::__cxx11::string&,Lexer::Type&>
              ((vector<std::tuple<std::__cxx11::string,Lexer::Type>,std::allocator<std::tuple<std::__cxx11::string,Lexer::Type>>>
                *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (Type *)&lexer.field_0x3c);
  }
  token.field_2._M_local_buf[0xf] = '\x01';
  ~Lexer((Lexer *)local_88);
  std::__cxx11::string::~string((string *)local_40);
  if ((token.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <std::tuple <std::string, Lexer::Type>> Lexer::tokenize (const std::string& input)
{
  std::vector <std::tuple <std::string, Lexer::Type>> tokens;

  std::string token;
  Lexer::Type type;
  Lexer lexer (input);
  while (lexer.token (token, type))
    tokens.emplace_back (token, type);

  return tokens;
}